

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

string * __thiscall
t_perl_generator::perl_namespace_abi_cxx11_
          (string *__return_storage_ptr__,t_perl_generator *this,t_program *p)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string ns;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"perl",(allocator *)&local_90);
  t_program::get_namespace(&ns,p,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_90);
  if (ns._M_string_length != 0) {
    while( true ) {
      lVar1 = std::__cxx11::string::find((char *)&ns,0x2fd4e8);
      if (lVar1 == -1) break;
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&ns);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&ns);
      std::__cxx11::string::operator=((string *)&ns,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    if (ns._M_string_length != 0) {
      std::operator+(&local_90,&ns,"::");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  std::__cxx11::string::~string((string *)&ns);
  return __return_storage_ptr__;
}

Assistant:

std::string perl_namespace(t_program* p) {
    std::string ns = p->get_namespace("perl");
    std::string result = "";
    std::string::size_type loc;

    if (ns.size() > 0) {
      while ((loc = ns.find(".")) != std::string::npos) {
        result += ns.substr(0, loc);
        result += "::";
        ns = ns.substr(loc + 1);
      }

      if (ns.size() > 0) {
        result += ns + "::";
      }
    }

    return result;
  }